

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O1

bool __thiscall
GraphContigger::solve_unclassified(GraphContigger *this,TangleView *t,Strider *s,GraphEditor *ge)

{
  pointer pNVar1;
  long lVar2;
  vector<long,_std::allocator<long>_> *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pvVar6;
  GraphEditor *this_00;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  _Var7;
  SequenceDistanceGraph *pSVar8;
  NodeView *x_2;
  pointer pvVar9;
  pointer pNVar10;
  bool bVar11;
  reverse_iterator i;
  _Hash_node_base *p_Var12;
  long *i_1;
  _Hash_node_base *p_Var13;
  __node_base _Var14;
  vector<long,_std::allocator<long>_> *pvVar15;
  NodeView *f;
  vector<long,_std::allocator<long>_> *pvVar16;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> temp_set;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  sols;
  vector<long,_std::allocator<long>_> tpath;
  vector<long,_std::allocator<long>_> fnids;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  map_values;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  ns;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  fs;
  undefined1 local_208 [16];
  __node_base local_1f8;
  SequenceDistanceGraph *pSStack_1f0;
  float local_1e8;
  size_t local_1e0;
  __node_base_ptr ap_Stack_1d8 [2];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_1c8;
  string local_1a8;
  vector<long,_std::allocator<long>_> local_188;
  TangleView *local_168;
  Strider *local_160;
  GraphContigger *local_158;
  _Hash_node_base *local_150;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_148;
  GraphEditor *local_130;
  pointer local_128;
  SequenceDistanceGraphPath local_120;
  _Hashtable<long,_std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_100;
  vector<long,_std::allocator<long>_> local_c8;
  vector<long,_std::allocator<long>_> local_b0;
  vector<long,_std::allocator<long>_> local_98;
  vector<long,_std::allocator<long>_> local_80;
  _Hashtable<long,_std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  pNVar10 = (t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar1 = (t->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)(((long)(t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(t->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4) + ((long)pNVar1 - (long)pNVar10 >> 4)) <
      0xc9) {
    local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    local_168 = t;
    local_160 = s;
    local_158 = this;
    if (pNVar10 != pNVar1) {
      do {
        local_68._M_buckets = (__buckets_ptr)pNVar10->id;
        if (local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&local_188,
                     (iterator)
                     local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)&local_68);
        }
        else {
          *local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_finish = (long)local_68._M_buckets;
          local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        pNVar10 = pNVar10 + 1;
      } while (pNVar10 != pNVar1);
    }
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    pNVar10 = (local_168->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl
              .super__Vector_impl_data._M_start;
    pNVar1 = (local_168->frontiers).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_130 = ge;
    if (pNVar10 != pNVar1) {
      do {
        lVar2 = pNVar10->id;
        Strider::stride_out_in_order
                  ((SequenceDistanceGraphPath *)local_208,local_160,-pNVar10->id,true,true,false);
        local_100._M_buckets = (__buckets_ptr)-lVar2;
        local_100._M_bucket_count = local_208._0_8_;
        local_100._M_before_begin._M_nxt = (_Hash_node_base *)local_208._8_8_;
        local_100._M_element_count = (size_type)local_1f8._M_nxt;
        local_208._0_8_ = (_Hash_node_base *)0x0;
        local_208._8_8_ = (_Hash_node_base *)0x0;
        local_1f8._M_nxt = (_Hash_node_base *)0x0;
        std::
        _Hashtable<long,std::pair<long_const,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<long,std::vector<long,std::allocator<long>>>>
                  ((_Hashtable<long,std::pair<long_const,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&local_68,&local_100);
        if ((_Hash_node_base *)local_100._M_bucket_count != (_Hash_node_base *)0x0) {
          operator_delete((void *)local_100._M_bucket_count,
                          local_100._M_element_count - local_100._M_bucket_count);
        }
        if ((_Hash_node_base *)local_208._0_8_ != (_Hash_node_base *)0x0) {
          operator_delete((void *)local_208._0_8_,(long)local_1f8._M_nxt - local_208._0_8_);
        }
        pNVar10 = pNVar10 + 1;
      } while (pNVar10 != pNVar1);
    }
    local_100._M_buckets = &local_100._M_single_bucket;
    local_100._M_bucket_count = 1;
    local_100._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_100._M_element_count = 0;
    local_100._M_rehash_policy._M_max_load_factor = 1.0;
    local_100._M_rehash_policy._M_next_resize = 0;
    local_100._M_single_bucket = (__node_base_ptr)0x0;
    pNVar10 = (local_168->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl
              .super__Vector_impl_data._M_start;
    local_128 = (local_168->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (pNVar10 != local_128) {
      do {
        local_1a8._M_dataplus._M_p = (pointer)0x0;
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_allocated_capacity = 0;
        Strider::stride_out_in_order
                  ((SequenceDistanceGraphPath *)local_208,local_160,-pNVar10->id,true,true,false);
        uVar4 = local_208._0_8_;
        local_150 = local_1f8._M_nxt;
        p_Var13 = (_Hash_node_base *)(local_208._0_8_ + 8);
        for (p_Var12 = (_Hash_node_base *)local_208._8_8_; p_Var13 < p_Var12; p_Var12 = p_Var12 + -1
            ) {
          local_208._0_8_ = -(long)p_Var12[-1]._M_nxt;
          if (local_1a8._M_string_length == local_1a8.field_2._M_allocated_capacity) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      ((vector<long,_std::allocator<long>_> *)&local_1a8,
                       (iterator)local_1a8._M_string_length,(long *)local_208);
          }
          else {
            *(undefined8 *)local_1a8._M_string_length = local_208._0_8_;
            local_1a8._M_string_length = local_1a8._M_string_length + 8;
          }
        }
        Strider::stride_out_in_order
                  ((SequenceDistanceGraphPath *)local_208,local_160,pNVar10->id,true,true,false);
        uVar5 = local_208._8_8_;
        for (p_Var13 = (_Hash_node_base *)local_208._0_8_; p_Var13 != (_Hash_node_base *)uVar5;
            p_Var13 = p_Var13 + 1) {
          local_120.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((long)&p_Var13->_M_nxt[-1]._M_nxt + 7);
          if (local_1a8._M_string_length == local_1a8.field_2._M_allocated_capacity) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      ((vector<long,_std::allocator<long>_> *)&local_1a8,
                       (iterator)local_1a8._M_string_length,(long *)&local_120);
          }
          else {
            *(pointer *)local_1a8._M_string_length =
                 local_120.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_1a8._M_string_length = local_1a8._M_string_length + 8;
          }
        }
        if ((_Hash_node_base *)local_208._0_8_ != (_Hash_node_base *)0x0) {
          operator_delete((void *)local_208._0_8_,(long)local_1f8._M_nxt - local_208._0_8_);
        }
        local_208._0_8_ = pNVar10->id;
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)(local_208 + 8),
                   (vector<long,_std::allocator<long>_> *)&local_1a8);
        std::
        _Hashtable<long,std::pair<long_const,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<long,std::vector<long,std::allocator<long>>>>
                  ((_Hashtable<long,std::pair<long_const,std::vector<long,std::allocator<long>>>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&local_100,local_208);
        if ((_Hash_node_base *)local_208._8_8_ != (_Hash_node_base *)0x0) {
          operator_delete((void *)local_208._8_8_,(long)pSStack_1f0 - local_208._8_8_);
        }
        if ((_Hash_node_base *)uVar4 != (_Hash_node_base *)0x0) {
          operator_delete((void *)uVar4,(long)local_150 - uVar4);
        }
        if (local_1a8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          local_1a8.field_2._M_allocated_capacity - (long)local_1a8._M_dataplus._M_p
                         );
        }
        pNVar10 = pNVar10 + 1;
      } while (pNVar10 != local_128);
    }
    local_1c8.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (vector<long,_std::allocator<long>_> *)0x0;
    local_1c8.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (vector<long,_std::allocator<long>_> *)0x0;
    local_1c8.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (vector<long,_std::allocator<long>_> *)0x0;
    local_148.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (vector<long,_std::allocator<long>_> *)0x0;
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var14._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back(&local_148,(value_type *)(_Var14._M_nxt + 2));
        _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
      } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
    }
    if (local_100._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var14._M_nxt = local_100._M_before_begin._M_nxt;
      do {
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::push_back(&local_148,(value_type *)(_Var14._M_nxt + 2));
        _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
      } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
    }
    pvVar6 = local_148.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_148.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_148.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pvVar9 = local_148.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::vector<long,_std::allocator<long>_>::vector(&local_80,pvVar9);
        std::vector<long,_std::allocator<long>_>::vector(&local_98,&local_188);
        end_to_end_solution((vector<long,_std::allocator<long>_> *)local_208,local_158,&local_80,
                            &local_98);
        if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((local_208._8_8_ != local_208._0_8_) &&
           (_Var7 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<long,std::allocator<long>>const>>
                              (local_1c8.
                               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_1c8.
                               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,local_208),
           _Var7._M_current ==
           local_1c8.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back(&local_1c8,(value_type *)local_208);
        }
        if ((_Hash_node_base *)local_208._0_8_ != (_Hash_node_base *)0x0) {
          operator_delete((void *)local_208._0_8_,(long)local_1f8._M_nxt - local_208._0_8_);
        }
        pvVar9 = pvVar9 + 1;
      } while (pvVar9 != pvVar6);
    }
    pvVar6 = local_1c8.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_208._0_8_ = ap_Stack_1d8;
    local_208._8_8_ = (pointer)0x1;
    local_1f8._M_nxt = (_Hash_node_base *)0x0;
    pSStack_1f0 = (SequenceDistanceGraph *)0x0;
    local_1e8 = 1.0;
    local_1e0 = 0;
    ap_Stack_1d8[0] = (__node_base_ptr)0x0;
    pvVar16 = local_1c8.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = local_1c8.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar15 = local_1c8.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_1c8.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pvVar16,
        local_1c8.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar3, pvVar15 != pvVar6;
        pvVar15 = pvVar15 + 1) {
      std::
      _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<long_const&>
                ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_208,
                 (pvVar15->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      pvVar16 = local_1c8.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = local_1c8.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pvVar16 != pvVar3) {
      do {
        local_1a8._M_dataplus._M_p =
             (pointer)-(pvVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_finish[-1];
        std::
        _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_emplace<long>((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_208,&local_1a8);
        pvVar16 = pvVar16 + 1;
      } while (pvVar16 != pvVar3);
    }
    pvVar6 = local_1c8.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar8 = (SequenceDistanceGraph *)
             ((long)local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
    bVar11 = false;
    if ((((long)local_1c8.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1c8.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
         ((ulong)pSVar8 >> 1) == 0) && (bVar11 = false, pSStack_1f0 == pSVar8)) {
      if (local_1c8.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c8.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pvVar9 = local_1c8.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pSVar8 = *(SequenceDistanceGraph **)local_158;
          std::vector<long,_std::allocator<long>_>::vector(&local_b0,pvVar9);
          std::vector<long,_std::allocator<long>_>::vector(&local_120.nodes,&local_b0);
          local_120.sg = pSVar8;
          SequenceDistanceGraphPath::sequence_abi_cxx11_(&local_1a8,&local_120);
          if (local_120.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_120.nodes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_120.nodes.super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_120.nodes.super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          pvVar9 = pvVar9 + 1;
        } while (pvVar9 != pvVar6);
      }
      this_00 = local_130;
      pvVar6 = local_1c8.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1c8.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c8.
          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pvVar9 = local_1c8.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::vector<long,_std::allocator<long>_>::vector(&local_c8,pvVar9);
          GraphEditor::queue_path_detachment(this_00,&local_c8,true);
          if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          pvVar9 = pvVar9 + 1;
        } while (pvVar9 != pvVar6);
      }
      pNVar1 = (local_168->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar11 = true;
      for (pNVar10 = (local_168->internals).super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                     _M_impl.super__Vector_impl_data._M_start; pNVar10 != pNVar1;
          pNVar10 = pNVar10 + 1) {
        GraphEditor::queue_node_deletion(this_00,pNVar10->id);
      }
    }
    std::
    _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_208);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&local_148);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&local_1c8);
    std::
    _Hashtable<long,_std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_100);
    std::
    _Hashtable<long,_std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    if (local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_188.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool GraphContigger::solve_unclassified(TangleView &t, Strider &s, GraphEditor &ge){
    if (t.frontiers.size()+t.internals.size()>200) return false;
    std::vector<sgNodeID_t> fnids;
    for (const auto& f: t.frontiers) fnids.push_back(f.node_id());

//    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> sols;
//    for (const auto& fnid: fnids) sols.insert(std::make_pair(fnid, std::vector<sgNodeID_t>()));
    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> fs;
    for (const auto&f: t.frontiers) {
        fs.insert(std::make_pair(-f.node_id(), s.stride_out_in_order(-f.node_id()).nodes));
    }

    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> ns;
    for (const auto&nv: t.internals){

        std::vector<sgNodeID_t> tpath;
        auto stride_back = s.stride_out_in_order(-nv.node_id()).nodes;
        for (auto i=stride_back.rbegin(); i<stride_back.rend()-1; ++i){
            tpath.push_back(*i*-1);
        }
        for (const auto &i: s.stride_out_in_order(nv.node_id()).nodes){
            tpath.push_back(i-1);
        }
        ns.insert(std::make_pair(nv.node_id(), tpath));
    }

    std::vector<std::vector<sgNodeID_t >> sols;
    std::vector<std::vector<sgNodeID_t>> map_values;
    for (const auto &v: fs){map_values.push_back(v.second);}
    for (const auto &v: ns){map_values.push_back(v.second);}


    for (const auto& x: map_values){
        auto sol=end_to_end_solution(x, fnids);
        if (sol.size()>0 and std::find(sols.begin(), sols.end(), sol)==sols.end()){
            sols.push_back(sol);
        }
    }

    std::unordered_set<sgNodeID_t> temp_set;
    for (const auto &x: sols){
        temp_set.emplace(x[0]);
    }
    for (const auto &x: sols){
        temp_set.emplace(-x.back());
    }

    if (sols.size() == fnids.size()/2 and temp_set.size() == fnids.size()){
        for (const auto &x: sols){
            try {
                auto ps=SequenceDistanceGraphPath(ws.sdg,x).sequence();
            } catch (...) {
                return false;
            }
        }
        for (const auto &x: sols) ge.queue_path_detachment(x, true);
        for (const auto &x: t.internals) ge.queue_node_deletion(x.node_id());
        return true;
    }
    return false;
}